

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

void alpha_blend(Fl_RGB_Image *img,int X,int Y,int W,int H,int cx,int cy)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar *puVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  byte *p;
  byte *pbVar9;
  byte *pbVar10;
  int local_60;
  int local_5c;
  int x_1;
  int y_1;
  int x;
  int y;
  uchar dsta;
  uchar dstb;
  uchar dstg;
  uchar dstr;
  uchar srca;
  uchar srcb;
  uchar srcg;
  uchar srcr;
  uchar *dstptr;
  uchar *dst;
  byte *pbStack_30;
  int srcskip;
  uchar *srcptr;
  int ld;
  int cx_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_RGB_Image *img_local;
  
  srcptr._0_4_ = Fl_Image::ld(&img->super_Fl_Image);
  if ((int)srcptr == 0) {
    iVar7 = Fl_Image::w(&img->super_Fl_Image);
    iVar8 = Fl_Image::d(&img->super_Fl_Image);
    srcptr._0_4_ = iVar7 * iVar8;
  }
  puVar4 = img->array;
  iVar7 = Fl_Image::d(&img->super_Fl_Image);
  pbStack_30 = puVar4 + (long)(cx * iVar7) + (long)(cy * (int)srcptr);
  iVar7 = Fl_Image::d(&img->super_Fl_Image);
  iVar7 = (int)srcptr - iVar7 * W;
  p = (byte *)operator_new__((long)(W * H * 3));
  fl_read_image(p,X,Y,W,H,0);
  iVar8 = Fl_Image::d(&img->super_Fl_Image);
  local_5c = H;
  y_1 = H;
  _dsta = p;
  if (iVar8 == 2) {
    for (; x_1 = W, 0 < y_1; y_1 = y_1 + -1) {
      for (; 0 < x_1; x_1 = x_1 + -1) {
        pbVar9 = pbStack_30 + 1;
        bVar1 = *pbStack_30;
        pbStack_30 = pbStack_30 + 2;
        bVar2 = *pbVar9;
        pbVar9 = _dsta + 2;
        bVar5 = -bVar2 - 1;
        *_dsta = (byte)((uint)bVar1 * (uint)bVar2 + (uint)*_dsta * (uint)bVar5 >> 8);
        pbVar10 = _dsta + 2;
        _dsta[1] = (byte)((uint)bVar1 * (uint)bVar2 + (uint)_dsta[1] * (uint)bVar5 >> 8);
        _dsta = _dsta + 3;
        *pbVar10 = (byte)((uint)bVar1 * (uint)bVar2 + (uint)*pbVar9 * (uint)bVar5 >> 8);
      }
      pbStack_30 = pbStack_30 + iVar7;
    }
  }
  else {
    for (; local_60 = W, 0 < local_5c; local_5c = local_5c + -1) {
      for (; 0 < local_60; local_60 = local_60 + -1) {
        bVar1 = *pbStack_30;
        bVar2 = pbStack_30[1];
        pbVar9 = pbStack_30 + 3;
        bVar5 = pbStack_30[2];
        pbStack_30 = pbStack_30 + 4;
        bVar3 = *pbVar9;
        pbVar9 = _dsta + 2;
        bVar6 = -bVar3 - 1;
        *_dsta = (byte)((uint)bVar1 * (uint)bVar3 + (uint)*_dsta * (uint)bVar6 >> 8);
        pbVar10 = _dsta + 2;
        _dsta[1] = (byte)((uint)bVar2 * (uint)bVar3 + (uint)_dsta[1] * (uint)bVar6 >> 8);
        _dsta = _dsta + 3;
        *pbVar10 = (byte)((uint)bVar5 * (uint)bVar3 + (uint)*pbVar9 * (uint)bVar6 >> 8);
      }
      pbStack_30 = pbStack_30 + iVar7;
    }
  }
  fl_draw_image(p,X,Y,W,H,3,0);
  if (p != (byte *)0x0) {
    operator_delete__(p);
  }
  return;
}

Assistant:

static void alpha_blend(Fl_RGB_Image *img, int X, int Y, int W, int H, int cx, int cy) {
  int ld = img->ld();
  if (ld == 0) ld = img->w() * img->d();
  uchar *srcptr = (uchar*)img->array + cy * ld + cx * img->d();
  int srcskip = ld - img->d() * W;

  uchar *dst = new uchar[W * H * 3];
  uchar *dstptr = dst;

  fl_read_image(dst, X, Y, W, H, 0);

  uchar srcr, srcg, srcb, srca;
  uchar dstr, dstg, dstb, dsta;

  if (img->d() == 2) {
    // Composite grayscale + alpha over RGB...
    for (int y = H; y > 0; y--, srcptr+=srcskip)
      for (int x = W; x > 0; x--) {
	srcg = *srcptr++;
	srca = *srcptr++;

	dstr = dstptr[0];
	dstg = dstptr[1];
	dstb = dstptr[2];
	dsta = 255 - srca;

	*dstptr++ = (srcg * srca + dstr * dsta) >> 8;
	*dstptr++ = (srcg * srca + dstg * dsta) >> 8;
	*dstptr++ = (srcg * srca + dstb * dsta) >> 8;
      }
  } else {
    // Composite RGBA over RGB...
    for (int y = H; y > 0; y--, srcptr+=srcskip)
      for (int x = W; x > 0; x--) {
	srcr = *srcptr++;
	srcg = *srcptr++;
	srcb = *srcptr++;
	srca = *srcptr++;

	dstr = dstptr[0];
	dstg = dstptr[1];
	dstb = dstptr[2];
	dsta = 255 - srca;

	*dstptr++ = (srcr * srca + dstr * dsta) >> 8;
	*dstptr++ = (srcg * srca + dstg * dsta) >> 8;
	*dstptr++ = (srcb * srca + dstb * dsta) >> 8;
      }
  }

  fl_draw_image(dst, X, Y, W, H, 3, 0);

  delete[] dst;
}